

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void outputVector<double>
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *vector,string *filename)

{
  char cVar1;
  pointer pdVar2;
  pointer pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ofstream stream;
  char local_231;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)filename);
  pvVar3 = (vector->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((vector->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar3) {
    uVar5 = 0;
    do {
      pdVar2 = pvVar3[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvVar3[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar2) {
        uVar6 = 0;
        do {
          std::ostream::_M_insert<double>(pdVar2[uVar6]);
          pvVar3 = (vector->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pdVar2 = pvVar3[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = (long)*(pointer *)
                         ((long)&pvVar3[uVar5].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data + 8) - (long)pdVar2 >> 3;
          if (uVar6 != uVar4 - 1) {
            local_231 = ',';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
            pvVar3 = (vector->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pdVar2 = pvVar3[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar4 = (long)*(pointer *)
                           ((long)&pvVar3[uVar5].super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data + 8) - (long)pdVar2 >> 3;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar4);
      }
      cVar1 = (char)(string *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
      pvVar3 = (vector->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(vector->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
              -0x5555555555555555;
    } while (uVar5 <= uVar6 && uVar6 - uVar5 != 0);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void outputVector(const std::vector<std::vector<T> > &vector, std::string filename){
    std::ofstream stream;
    stream.open(filename, std::ios::out);

    for(int i=0;i<vector.size();i++){
        for(int j=0;j<vector[i].size();j++){
            stream<<vector[i][j];
            if(j!=(vector[i].size()-1)){
                stream<<',';
            }
        }
        stream<<std::endl;
    }
    stream.close();
}